

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall TestTable::testTable(TestTable *this)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  QWidget *pQVar5;
  ulong uVar6;
  TableView *pTVar7;
  TableViewSection *pTVar8;
  TableViewCell *pTVar9;
  ScrollArea *this_00;
  AbstractScrollArea *pAVar10;
  undefined1 auStack_30 [4];
  int cc;
  QRect r;
  undefined8 local_18;
  QPoint p;
  TestTable *this_local;
  
  p = (QPoint)this;
  pQVar5 = (QWidget *)QSharedPointer<QtMWidgets::TableView>::operator->(&this->m_v);
  QWidget::resize(pQVar5,200,400);
  QSharedPointer<QtMWidgets::TableView>::operator->(&this->m_v);
  QWidget::show();
  pQVar5 = (QWidget *)QSharedPointer<QtMWidgets::TableView>::data(&this->m_v);
  bVar1 = QTest::qWaitForWindowActive(pQVar5,5000);
  uVar6 = QTest::qVerify((bool)(bVar1 & 1),"QTest::qWaitForWindowActive( m_v.data() )","",
                         "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/table/main.cpp"
                         ,0x68);
  if ((uVar6 & 1) != 0) {
    pTVar7 = QSharedPointer<QtMWidgets::TableView>::operator->(&this->m_v);
    pTVar8 = QtMWidgets::TableView::sectionAt(pTVar7,0);
    uVar6 = QTest::qVerify(pTVar8 == this->m_ringerAndAlerts,
                           "m_v->sectionAt( 0 ) == m_ringerAndAlerts","",
                           "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/table/main.cpp"
                           ,0x6a);
    if ((uVar6 & 1) != 0) {
      pTVar7 = QSharedPointer<QtMWidgets::TableView>::operator->(&this->m_v);
      pTVar8 = QtMWidgets::TableView::sectionAt(pTVar7,1);
      uVar6 = QTest::qVerify(pTVar8 == this->m_sounds,"m_v->sectionAt( 1 ) == m_sounds","",
                             "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/table/main.cpp"
                             ,0x6b);
      if ((uVar6 & 1) != 0) {
        pTVar7 = QSharedPointer<QtMWidgets::TableView>::operator->(&this->m_v);
        bVar2 = QtMWidgets::TableView::highlightCellOnClick(pTVar7);
        uVar6 = QTest::qVerify(bVar2,"m_v->highlightCellOnClick() == true","",
                               "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/table/main.cpp"
                               ,0x6d);
        if ((uVar6 & 1) != 0) {
          bVar2 = QtMWidgets::TableViewSection::highlightCellOnClick(this->m_ringerAndAlerts);
          uVar6 = QTest::qVerify(bVar2,"m_ringerAndAlerts->highlightCellOnClick() == true","",
                                 "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/table/main.cpp"
                                 ,0x6e);
          if ((uVar6 & 1) != 0) {
            iVar3 = QtMWidgets::TableViewSection::cellsCount(this->m_ringerAndAlerts);
            uVar6 = QTest::qVerify(iVar3 == 2,"m_ringerAndAlerts->cellsCount() == 2","",
                                   "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/table/main.cpp"
                                   ,0x70);
            if ((uVar6 & 1) != 0) {
              pTVar9 = QtMWidgets::TableViewSection::cellAt(this->m_ringerAndAlerts,0);
              uVar6 = QTest::qVerify(pTVar9 == this->m_volume,
                                     "m_ringerAndAlerts->cellAt( 0 ) == m_volume","",
                                     "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/table/main.cpp"
                                     ,0x71);
              if ((uVar6 & 1) != 0) {
                bVar2 = QtMWidgets::TableViewCell::highlightOnClick(this->m_volume);
                uVar6 = QTest::qVerify(bVar2,"m_volume->highlightOnClick() == true","",
                                       "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/table/main.cpp"
                                       ,0x72);
                if ((uVar6 & 1) != 0) {
                  this_00 = &QSharedPointer<QtMWidgets::TableView>::operator->(&this->m_v)->
                             super_ScrollArea;
                  QtMWidgets::ScrollArea::ensureWidgetVisible
                            (this_00,&this->m_facebookPost->super_QWidget,0x32,0x32);
                  QTest::qWait(0x226);
                  pTVar8 = this->m_sounds;
                  pAVar10 = (AbstractScrollArea *)
                            QSharedPointer<QtMWidgets::TableView>::operator->(&this->m_v);
                  pQVar5 = QtMWidgets::AbstractScrollArea::viewport(pAVar10);
                  r._8_8_ = QWidget::pos();
                  local_18 = QWidget::mapTo(&pTVar8->super_QWidget,(QPoint *)pQVar5);
                  pAVar10 = (AbstractScrollArea *)
                            QSharedPointer<QtMWidgets::TableView>::operator->(&this->m_v);
                  pQVar5 = QtMWidgets::AbstractScrollArea::viewport(pAVar10);
                  _auStack_30 = QWidget::rect(pQVar5);
                  bVar1 = QRect::contains((QPoint *)auStack_30,SUB81(&local_18,0));
                  uVar6 = QTest::qVerify((bool)(bVar1 & 1),"r.contains( p )","",
                                         "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/table/main.cpp"
                                         ,0x7c);
                  if ((uVar6 & 1) != 0) {
                    iVar3 = QtMWidgets::TableViewSection::cellsCount(this->m_sounds);
                    QtMWidgets::TableViewSection::removeCell(this->m_sounds,this->m_facebookPost);
                    QObject::deleteLater();
                    QTest::qWait(0x32);
                    iVar4 = QtMWidgets::TableViewSection::cellsCount(this->m_sounds);
                    uVar6 = QTest::qVerify(iVar4 == iVar3 + -1,"m_sounds->cellsCount() == cc - 1",""
                                           ,
                                           "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/table/main.cpp"
                                           ,0x86);
                    if ((uVar6 & 1) != 0) {
                      pTVar7 = QSharedPointer<QtMWidgets::TableView>::operator->(&this->m_v);
                      QtMWidgets::TableView::removeSection(pTVar7,this->m_sounds);
                      QObject::deleteLater();
                      pTVar7 = QSharedPointer<QtMWidgets::TableView>::operator->(&this->m_v);
                      iVar3 = QtMWidgets::TableView::sectionsCount(pTVar7);
                      uVar6 = QTest::qVerify(iVar3 == 1,"m_v->sectionsCount() == 1","",
                                             "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/table/main.cpp"
                                             ,0x8c);
                      if ((uVar6 & 1) != 0) {
                        QTest::qWait(0x32);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void testTable()
	{
		m_v->resize( 200, 400 );
		m_v->show();

		QVERIFY( QTest::qWaitForWindowActive( m_v.data() ) );

		QVERIFY( m_v->sectionAt( 0 ) == m_ringerAndAlerts );
		QVERIFY( m_v->sectionAt( 1 ) == m_sounds );

		QVERIFY( m_v->highlightCellOnClick() == true );
		QVERIFY( m_ringerAndAlerts->highlightCellOnClick() == true );

		QVERIFY( m_ringerAndAlerts->cellsCount() == 2 );
		QVERIFY( m_ringerAndAlerts->cellAt( 0 ) == m_volume );
		QVERIFY( m_volume->highlightOnClick() == true );

		m_v->ensureWidgetVisible( m_facebookPost );

		QTest::qWait( 550 );

		const auto p = m_sounds->mapTo( m_v->viewport(), m_facebookPost->pos() );

		const QRect r = m_v->viewport()->rect();

		QVERIFY( r.contains( p ) );

		const auto cc = m_sounds->cellsCount();

		m_sounds->removeCell( m_facebookPost );

		m_facebookPost->deleteLater();

		QTest::qWait( 50 );

		QVERIFY( m_sounds->cellsCount() == cc - 1 );

		m_v->removeSection( m_sounds );

		m_sounds->deleteLater();

		QVERIFY( m_v->sectionsCount() == 1 );

		QTest::qWait( 50 );
	}